

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::CheckTypeStackEnd(TypeChecker *this,char *desc)

{
  Label *desc_00;
  bool bVar1;
  size_type sVar2;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  Result local_30;
  Enum local_2c;
  Label *local_28;
  Label *label;
  char *desc_local;
  TypeChecker *this_local;
  Result result;
  
  label = (Label *)desc;
  desc_local = (char *)this;
  local_2c = (Enum)TopLabel(this,&local_28);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    Result::Result((Result *)((long)&this_local + 4),(uint)(sVar2 != local_28->type_stack_limit));
    desc_00 = label;
    local_30.enum_ = this_local._4_4_;
    memset(&local_48,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48);
    PrintStackIfFailedV(this,local_30,(char *)desc_00,&local_48,true);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_48);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckTypeStackEnd(const char* desc) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  Result result = (type_stack_.size() == label->type_stack_limit)
                      ? Result::Ok
                      : Result::Error;
  PrintStackIfFailedV(result, desc, {}, /*is_end=*/true);
  return result;
}